

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  u8 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pEnd;
  byte *pbVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  byte *pbVar14;
  long lVar15;
  char *p2;
  char *p1;
  sqlite3_int64 iVal;
  char *p_1;
  byte *local_90;
  byte *local_88;
  long local_80;
  byte *local_78;
  byte *local_70;
  byte *local_68;
  int local_60;
  int local_5c;
  Fts3Phrase *local_58;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  long local_38;
  
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (p->doclist).aAll = (char *)0x0;
    (p->doclist).nAll = 0;
  }
  else {
    iVar4 = p->iDoclistToken;
    if (iVar4 < 0) {
      (p->doclist).aAll = pList;
      (p->doclist).nAll = nList;
    }
    else {
      pbVar14 = (byte *)(p->doclist).aAll;
      if (pbVar14 != (byte *)0x0) {
        iVar10 = (p->doclist).nAll;
        local_5c = iVar4 - iToken;
        pbVar5 = pbVar14;
        iVar13 = nList;
        if (iVar4 < iToken) {
          local_5c = iToken - iVar4;
          pbVar5 = (byte *)pList;
          pList = (char *)pbVar14;
          iVar13 = iVar10;
          iVar10 = nList;
        }
        uVar1 = pTab->bDescIdx;
        local_90 = pbVar5;
        local_88 = (byte *)pList;
        local_78 = pbVar5;
        local_70 = (byte *)pList;
        if ((uVar1 == '\0') || (pbVar5 = (byte *)sqlite3_malloc(iVar10 + 10), pbVar5 != (byte *)0x0)
           ) {
          pbVar14 = local_70;
          local_68 = pbVar5;
          local_60 = iToken;
          local_58 = p;
          local_48 = pbVar5;
          if (iVar13 < 1) {
            local_88 = (byte *)0x0;
            lVar15 = 0;
          }
          else {
            iVar4 = sqlite3Fts3GetVarint((char *)local_70,&local_80);
            local_88 = pbVar14 + iVar4;
            lVar15 = local_80;
          }
          pbVar14 = local_78;
          if (iVar10 < 1) {
            local_90 = (byte *)0x0;
            lVar12 = 0;
          }
          else {
            iVar4 = sqlite3Fts3GetVarint((char *)local_78,&local_80);
            local_90 = pbVar14 + iVar4;
            lVar12 = local_80;
          }
          if (local_90 != (byte *)0x0 && local_88 != (byte *)0x0) {
            local_50 = local_70 + iVar13;
            pbVar14 = local_78 + iVar10;
            bVar3 = false;
            lVar11 = 0;
            local_40 = pbVar14;
            do {
              pbVar5 = local_68;
              lVar9 = -(lVar15 - lVar12);
              if (uVar1 == '\0') {
                lVar9 = lVar15 - lVar12;
              }
              if (lVar9 == 0) {
                uVar6 = lVar11 - lVar15;
                if (!bVar3) {
                  uVar6 = lVar15 - lVar11;
                }
                if (uVar1 == '\0') {
                  uVar6 = lVar15 - lVar11;
                }
                do {
                  pbVar14 = local_68;
                  bVar7 = (byte)uVar6;
                  *pbVar14 = bVar7 | 0x80;
                  local_68 = pbVar14 + 1;
                  bVar2 = 0x7f < uVar6;
                  uVar6 = uVar6 >> 7;
                } while (bVar2);
                *pbVar14 = bVar7;
                local_38 = lVar11;
                iVar4 = fts3PoslistPhraseMerge
                                  ((char **)&local_68,local_5c,0,1,(char **)&local_88,
                                   (char **)&local_90);
                pbVar14 = local_88;
                lVar11 = lVar15;
                bVar2 = true;
                if (iVar4 == 0) {
                  lVar11 = local_38;
                  local_68 = pbVar5;
                  bVar2 = bVar3;
                }
                if (local_88 < local_50) {
                  iVar4 = sqlite3Fts3GetVarint((char *)local_88,&local_80);
                  local_88 = pbVar14 + iVar4;
                  lVar9 = -local_80;
                  if (uVar1 == '\0') {
                    lVar9 = local_80;
                  }
                  lVar15 = lVar15 + lVar9;
                }
                else {
                  local_88 = (byte *)0x0;
                }
                pbVar14 = local_40;
                pbVar5 = local_90;
                bVar3 = bVar2;
                if (local_90 < local_40) {
                  iVar4 = sqlite3Fts3GetVarint((char *)local_90,&local_80);
                  local_90 = pbVar5 + iVar4;
                  lVar9 = -local_80;
                  if (uVar1 == '\0') {
                    lVar9 = local_80;
                  }
                  lVar12 = lVar12 + lVar9;
                }
                else {
                  local_90 = (byte *)0x0;
                }
              }
              else if (lVar9 < 0) {
                bVar7 = *local_88;
                if (*local_88 != 0) {
                  do {
                    pbVar5 = local_88 + 1;
                    local_88 = local_88 + 1;
                    bVar8 = bVar7 & 0x80;
                    bVar7 = *pbVar5;
                  } while (bVar8 != 0 || *pbVar5 != 0);
                }
                local_88 = local_88 + 1;
                if (local_88 < local_50) {
                  iVar4 = sqlite3Fts3GetVarint((char *)local_88,&local_80);
                  local_88 = local_88 + iVar4;
                  lVar9 = -local_80;
                  if (uVar1 == '\0') {
                    lVar9 = local_80;
                  }
                  lVar15 = lVar15 + lVar9;
                }
                else {
                  local_88 = (byte *)0x0;
                }
              }
              else {
                bVar7 = *local_90;
                if (*local_90 != 0) {
                  do {
                    pbVar5 = local_90 + 1;
                    local_90 = local_90 + 1;
                    bVar8 = bVar7 & 0x80;
                    bVar7 = *pbVar5;
                  } while (bVar8 != 0 || *pbVar5 != 0);
                }
                local_90 = local_90 + 1;
                if (local_90 < pbVar14) {
                  iVar4 = sqlite3Fts3GetVarint((char *)local_90,&local_80);
                  local_90 = local_90 + iVar4;
                  lVar9 = -local_80;
                  if (uVar1 == '\0') {
                    lVar9 = local_80;
                  }
                  lVar12 = lVar12 + lVar9;
                }
                else {
                  local_90 = (byte *)0x0;
                }
              }
            } while ((local_88 != (byte *)0x0) && (local_90 != (byte *)0x0));
          }
          pbVar14 = local_48;
          iVar10 = (int)local_68 - (int)local_48;
          iVar4 = 0;
          pbVar5 = local_78;
          p = local_58;
          iToken = local_60;
          if (uVar1 != '\0') {
            sqlite3_free(local_78);
            pbVar5 = pbVar14;
            p = local_58;
            iToken = local_60;
          }
        }
        else {
          iVar4 = 7;
          pbVar5 = local_78;
          p = p;
        }
        sqlite3_free(local_70);
        (p->doclist).aAll = (char *)pbVar5;
        (p->doclist).nAll = iVar10;
        goto LAB_001810ab;
      }
      sqlite3_free(pList);
    }
  }
  iVar4 = 0;
LAB_001810ab:
  if (p->iDoclistToken < iToken) {
    p->iDoclistToken = iToken;
  }
  return iVar4;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}